

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DateFormatSymbols::getQuarters
          (DateFormatSymbols *this,int32_t *count,DtContextType context,DtWidthType width)

{
  if (context != STANDALONE) {
    if (context == FORMAT) {
      switch(width) {
      case ABBREVIATED:
      case SHORT:
        *count = this->fShortQuartersCount;
        return this->fShortQuarters;
      case WIDE:
        *count = this->fQuartersCount;
        return this->fQuarters;
      case NARROW:
switchD_002e3c14_caseD_2:
        *count = 0;
      }
    }
switchD_002e3c14_default:
    return (UnicodeString *)0x0;
  }
  switch(width) {
  case ABBREVIATED:
  case SHORT:
    *count = this->fStandaloneShortQuartersCount;
    return this->fStandaloneShortQuarters;
  case WIDE:
    *count = this->fStandaloneQuartersCount;
    return this->fStandaloneQuarters;
  case NARROW:
    goto switchD_002e3c14_caseD_2;
  default:
    goto switchD_002e3c14_default;
  }
}

Assistant:

const UnicodeString*
DateFormatSymbols::getQuarters(int32_t &count, DtContextType context, DtWidthType width ) const
{
    UnicodeString *returnValue = NULL;

    switch (context) {
    case FORMAT :
        switch(width) {
        case WIDE :
            count = fQuartersCount;
            returnValue = fQuarters;
            break;
        case ABBREVIATED :
        case SHORT : // no quarter data for this, defaults to ABBREVIATED
            count = fShortQuartersCount;
            returnValue = fShortQuarters;
            break;
        case NARROW :
            count = 0;
            returnValue = NULL;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch(width) {
        case WIDE :
            count = fStandaloneQuartersCount;
            returnValue = fStandaloneQuarters;
            break;
        case ABBREVIATED :
        case SHORT : // no quarter data for this, defaults to ABBREVIATED
            count = fStandaloneShortQuartersCount;
            returnValue = fStandaloneShortQuarters;
            break;
        case NARROW :
            count = 0;
            returnValue = NULL;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
    return returnValue;
}